

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O2

void __thiscall unit_test::main(unit_test *this,string *param_1)

{
  ostream *poVar1;
  ulong uVar2;
  uint i;
  long lVar3;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Running sync test\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  calls = calls + 1;
  cppcms::application::response();
  uVar2 = cppcms::http::response::out();
  lVar3 = 0;
  do {
    if (lVar3 == 10000000) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Sync Not disconnected!");
      std::endl<char,std::char_traits<char>>(poVar1);
      return;
    }
    poVar1 = std::ostream::_M_insert<unsigned_long>(uVar2);
    poVar1 = std::operator<<(poVar1,'\n');
    lVar3 = lVar3 + 1;
  } while (((byte)poVar1[*(long *)(*(long *)poVar1 + -0x18) + 0x20] & 5) == 0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Sync Disconned as expected");
  std::endl<char,std::char_traits<char>>(poVar1);
  bad_count = bad_count + 1;
  return;
}

Assistant:

virtual void main(std::string /*unused*/)
	{
		std::cout << "Running sync test\n" << std::endl;
		calls ++;
		bool bad_found = false;
		std::ostream &out = response().out();
		for(unsigned i=0;i<10000000;i++) {
			if(!(out << i << '\n')) {
				bad_found = true;
				break;
			}
		}
		if(bad_found) {
			std::cout << "Sync Disconned as expected" << std::endl;
			bad_count++;
		}
		else {
			std::cout << "Sync Not disconnected!" << std::endl;
		}
	}